

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O0

int16_t resolve_divisor_64(uint64_t D,int16_t *shift)

{
  int iVar1;
  short *in_RSI;
  ulong in_RDI;
  int64_t e;
  int64_t f;
  short local_24;
  long local_18;
  
  if (in_RDI >> 0x20 == 0) {
    iVar1 = get_msb((uint)in_RDI);
    local_24 = (short)iVar1;
  }
  else {
    iVar1 = get_msb((uint)(in_RDI >> 0x20));
    local_24 = (short)iVar1 + 0x20;
  }
  *in_RSI = local_24;
  local_18 = in_RDI - (1L << ((byte)*in_RSI & 0x3f));
  if (*in_RSI < 9) {
    local_18 = local_18 << (8U - (char)*in_RSI & 0x3f);
  }
  else {
    local_18 = local_18 + ((1L << ((char)*in_RSI - 8U & 0x3f)) >> 1) >> ((char)*in_RSI - 8U & 0x3f);
  }
  *in_RSI = *in_RSI + 0xe;
  return div_lut[local_18];
}

Assistant:

static int16_t resolve_divisor_64(uint64_t D, int16_t *shift) {
  int64_t f;
  *shift = (int16_t)((D >> 32) ? get_msb((unsigned int)(D >> 32)) + 32
                               : get_msb((unsigned int)D));
  // e is obtained from D after resetting the most significant 1 bit.
  const int64_t e = D - ((uint64_t)1 << *shift);
  // Get the most significant DIV_LUT_BITS (8) bits of e into f
  if (*shift > DIV_LUT_BITS)
    f = ROUND_POWER_OF_TWO_64(e, *shift - DIV_LUT_BITS);
  else
    f = e << (DIV_LUT_BITS - *shift);
  assert(f <= DIV_LUT_NUM);
  *shift += DIV_LUT_PREC_BITS;
  // Use f as lookup into the precomputed table of multipliers
  return div_lut[f];
}